

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O3

void __thiscall
QPixmapBlurFilter::draw
          (QPixmapBlurFilter *this,QPainter *painter,QPointF *p,QPixmap *src,QRectF *rect)

{
  long lVar1;
  double dVar2;
  char cVar3;
  bool bVar4;
  QTransform *pQVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined8 *puVar8;
  long in_FS_OFFSET;
  byte bVar9;
  undefined1 auVar10 [16];
  QRect QVar11;
  qreal scale;
  double local_110;
  QRect local_108;
  undefined1 local_f0 [16];
  QRect local_e0;
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  double local_b0;
  QRectF local_a8;
  undefined1 local_88 [16];
  undefined1 *local_78;
  double local_70;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  cVar3 = QPainter::isActive();
  QVar11.x2.m_i = local_e0.x2.m_i;
  QVar11.y2.m_i = local_e0.y2.m_i;
  QVar11.x1.m_i = local_e0.x1.m_i;
  QVar11.y1.m_i = local_e0.y1.m_i;
  if (cVar3 != '\0') {
    cVar3 = QPixmap::isNull();
    QVar11.x2.m_i = local_e0.x2.m_i;
    QVar11.y2.m_i = local_e0.y2.m_i;
    QVar11.x1.m_i = local_e0.x1.m_i;
    QVar11.y1.m_i = local_e0.y1.m_i;
    if (cVar3 == '\0') {
      local_a8.xp = rect->xp;
      local_a8.yp = rect->yp;
      local_a8.w = rect->w;
      local_a8.h = rect->h;
      if ((((local_a8.w == 0.0) && (!NAN(local_a8.w))) && (local_a8.h == 0.0)) && (!NAN(local_a8.h))
         ) {
        auVar10 = QPixmap::rect();
        local_a8.xp = (qreal)auVar10._0_4_;
        local_a8.yp = (qreal)auVar10._4_4_;
        local_a8.w = (qreal)(((long)auVar10._8_4_ - (long)auVar10._0_4_) + 1);
        local_a8.h = (qreal)(((auVar10._8_8_ >> 0x20) - (auVar10._0_8_ >> 0x20)) + 1);
      }
      local_110 = *(double *)(lVar1 + 0x80);
      if (local_110 <= 1.0) {
        dVar2 = p->yp + local_a8.yp;
        local_88._8_4_ = SUB84(dVar2,0);
        local_88._0_8_ = p->xp + local_a8.xp;
        local_88._12_4_ = (int)((ulong)dVar2 >> 0x20);
        local_78 = (undefined1 *)local_a8.w;
        local_70 = local_a8.h;
        QPainter::drawPixmap((QRectF *)painter,(QPixmap *)local_88,(QRectF *)src);
        QVar11.x2.m_i = local_e0.x2.m_i;
        QVar11.y2.m_i = local_e0.y2.m_i;
        QVar11.x1.m_i = local_e0.x1.m_i;
        QVar11.y1.m_i = local_e0.y1.m_i;
      }
      else {
        local_110 = local_110 * 2.5;
        local_b0 = -NAN;
        pQVar5 = (QTransform *)QPainter::transform();
        cVar3 = qt_scaleForTransform(pQVar5,&local_b0);
        if (cVar3 != '\0') {
          local_110 = local_110 / local_b0;
        }
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
        QImage::QImage((QImage *)&local_c8);
        local_88 = QPixmap::rect();
        bVar4 = comparesEqual(&local_a8,(QRect *)local_88);
        if (bVar4) {
          QPixmap::toImage();
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QPaintDevice::QPaintDevice((QPaintDevice *)local_88);
          local_78 = local_b8;
          local_b8 = (undefined1 *)local_d0;
          local_88._0_8_ = QFileSystemModel::setResolveSymlinks;
          local_d0 = 0;
          QImage::~QImage((QImage *)local_88);
          QImage::~QImage((QImage *)&local_e0);
        }
        else {
          QVar11 = (QRect)QRectF::toAlignedRect();
          local_88 = (undefined1  [16])QVar11;
          local_e0 = (QRect)QPixmap::rect();
          local_f0 = QRect::operator&((QRect *)local_88,&local_e0);
          QPixmap::copy(&local_108);
          QPixmap::toImage();
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QPaintDevice::QPaintDevice((QPaintDevice *)local_88);
          local_78 = local_b8;
          local_b8 = (undefined1 *)local_d0;
          local_88._0_8_ = QFileSystemModel::setResolveSymlinks;
          local_d0 = 0;
          QImage::~QImage((QImage *)local_88);
          QImage::~QImage((QImage *)&local_e0);
          QPixmap::~QPixmap((QPixmap *)&local_108);
        }
        puVar6 = (undefined8 *)QPainter::worldTransform();
        puVar8 = (undefined8 *)local_88;
        for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar8 = *puVar6;
          puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
          puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
        }
        QPainter::translate((QPointF *)painter);
        qt_blurImage(painter,(QImage *)&local_c8,local_110,
                     (bool)((byte)*(undefined4 *)(lVar1 + 0x88) & 1),false,0);
        QPainter::setWorldTransform((QTransform *)painter,SUB81(local_88,0));
        QImage::~QImage((QImage *)&local_c8);
        QVar11 = local_e0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  local_e0 = QVar11;
  __stack_chk_fail();
}

Assistant:

void QPixmapBlurFilter::draw(QPainter *painter, const QPointF &p, const QPixmap &src, const QRectF &rect) const
{
    Q_D(const QPixmapBlurFilter);
    if (!painter->isActive())
        return;

    if (src.isNull())
        return;

    QRectF srcRect = rect;
    if (srcRect.isNull())
        srcRect = src.rect();

    if (d->radius <= 1) {
        painter->drawPixmap(srcRect.translated(p), src, srcRect);
        return;
    }

    qreal scaledRadius = radiusScale * d->radius;
    qreal scale;
    if (qt_scaleForTransform(painter->transform(), &scale))
        scaledRadius /= scale;

    QImage srcImage;

    if (srcRect == src.rect()) {
        srcImage = src.toImage();
    } else {
        QRect rect = srcRect.toAlignedRect().intersected(src.rect());
        srcImage = src.copy(rect).toImage();
    }

    QTransform transform = painter->worldTransform();
    painter->translate(p);
    qt_blurImage(painter, srcImage, scaledRadius, (d->hints & QGraphicsBlurEffect::QualityHint), false);
    painter->setWorldTransform(transform);
}